

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O3

void continuous_dist_test_integrate_pdf<trng::exponential_dist<double>>(exponential_dist<double> *d)

{
  double dVar1;
  value_type vVar2;
  ulong uVar3;
  int i;
  int iVar4;
  double dVar5;
  char *pcVar6;
  vector<double,_std::allocator<double>_> y;
  result_type tol;
  AssertionHandler catchAssertionHandler;
  vector<double,_std::allocator<double>_> local_f8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  double local_c0;
  AssertionHandler local_b8;
  SourceLineInfo local_70;
  ITransientExpression local_60;
  double *local_50;
  char *local_48;
  size_t sStack_40;
  undefined8 *local_38;
  StringRef local_30;
  
  dVar1 = (d->P).mu_;
  dVar5 = dVar1 * 0.01005033585350145;
  local_d8._8_8_ = 0;
  local_d8._0_8_ = (dVar1 * 4.605170185988091 - dVar5) * 9.5367431640625e-07;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  iVar4 = 0;
  do {
    dVar1 = (double)iVar4 * (double)local_d8._0_8_ + dVar5;
    pcVar6 = (char *)0x0;
    if (0.0 <= dVar1) {
      dVar1 = exp(-dVar1 / (d->P).mu_);
      pcVar6 = (char *)(dVar1 / (d->P).mu_);
    }
    local_b8.m_assertionInfo.macroName.m_start = pcVar6;
    if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_f8,
                 (iterator)
                 local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)&local_b8);
    }
    else {
      *local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish = (double)pcVar6;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x100001);
  vVar2 = simpson_int<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  local_c8 = 0x3dd0000000000000;
  local_60._vptr_ITransientExpression = (_func_int **)0x2a6457;
  local_60.m_isBinaryExpression = true;
  local_60.m_result = false;
  local_60._10_6_ = 0;
  local_70.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_70.line = 0x94;
  Catch::StringRef::StringRef(&local_30,"std::abs(s - result_type(98) / result_type(100)) < tol");
  Catch::AssertionHandler::AssertionHandler
            (&local_b8,(StringRef *)&local_60,&local_70,local_30,Normal);
  local_c0 = ABS((double)local_d8._0_8_ * vVar2 + -0.98);
  uVar3 = local_d8._8_8_ & 0x7fffffffffffffff;
  local_d8._8_4_ = (int)uVar3;
  local_d8._0_8_ = local_c0;
  local_d8._12_4_ = (int)(uVar3 >> 0x20);
  Catch::StringRef::StringRef((StringRef *)&local_70,"<");
  local_60.m_result = (double)local_d8._0_8_ < 5.820766091346741e-11;
  local_60.m_isBinaryExpression = true;
  local_60._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_003182f8;
  local_48 = local_70.file;
  sStack_40 = local_70.line;
  local_38 = &local_c8;
  local_50 = &local_c0;
  Catch::AssertionHandler::handleExpr(&local_b8,&local_60);
  Catch::ITransientExpression::~ITransientExpression(&local_60);
  Catch::AssertionHandler::complete(&local_b8);
  if (local_b8.m_completed == false) {
    (*(local_b8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void continuous_dist_test_integrate_pdf(const dist &d) {
  using result_type = typename dist::result_type;
  const int samples(static_cast<int>(std::min(
      1024ll * 1024, static_cast<long long>(std::round(
                         1 / std::sqrt(std::numeric_limits<result_type>::epsilon()))))));
  const result_type x_min{d.icdf(result_type(1) / result_type(100))};
  const result_type x_max{d.icdf(result_type(99) / result_type(100))};
  const result_type dx{(x_max - x_min) / samples};
  std::vector<result_type> y;
  for (int i{0}; i <= samples; ++i)
    y.push_back(d.pdf(x_min + i * dx));
  const result_type s{simpson_int(y.begin(), y.end()) * dx};
  const result_type tol{result_type(64) / result_type(samples) / result_type(samples)};
  REQUIRE(std::abs(s - result_type(98) / result_type(100)) < tol);
}